

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O1

bool IsValidDestinationString(string *str,CChainParams *params)

{
  bool bVar1;
  long in_FS_OFFSET;
  string error_msg;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  _Stack_88;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  anon_unknown.dwarf_12430de::DecodeDestination
            ((CTxDestination *)&_Stack_88,str,params,&local_38,
             (vector<int,_std::allocator<int>_> *)0x0);
  bVar1 = IsValidDestination((CTxDestination *)&_Stack_88);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage(&_Stack_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsValidDestinationString(const std::string& str, const CChainParams& params)
{
    std::string error_msg;
    return IsValidDestination(DecodeDestination(str, params, error_msg, nullptr));
}